

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void * de::cmdline::detail::findNamedValueMatch
                 (char *src,void *namedValues,void *namedValuesEnd,size_t stride)

{
  bool bVar1;
  invalid_argument *this;
  void *curValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  string srcStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&srcStr,src,(allocator<char> *)&bStack_88);
  while( true ) {
    if (namedValues == namedValuesEnd) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_48,"unrecognized value \'",&srcStr);
      std::operator+(&bStack_88,&local_48,"\'");
      std::invalid_argument::invalid_argument(this,(string *)&bStack_88);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar1 = std::operator==(&srcStr,*namedValues);
    if (bVar1) break;
    namedValues = (void *)((long)namedValues + stride);
  }
  std::__cxx11::string::~string((string *)&srcStr);
  return (undefined8 *)namedValues;
}

Assistant:

const void* findNamedValueMatch (const char* src, const void* namedValues, const void* namedValuesEnd, size_t stride)
{
	std::string srcStr(src);

	for (const void* curValue = namedValues; curValue != namedValuesEnd; curValue = (const void*)((deUintptr)curValue + stride))
	{
		if (srcStr == getNamedValueName(curValue))
			return curValue;
	}

	throw std::invalid_argument("unrecognized value '" + srcStr + "'");
}